

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase739::run(TestCase739 *this)

{
  undefined8 *__n;
  char *__n_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int in_R8D;
  int local_3ac;
  DebugComparison<int,_unsigned_int> _kjCondition;
  uint local_388;
  undefined1 local_380 [28];
  int callerCallCount;
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  uint local_340;
  int calleeCallCount;
  WaitScope waitScope;
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult> response;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall2;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall1;
  Client caller;
  Client callee;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  request;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall0;
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> promise;
  Maybe<capnp::MessageSize> local_108;
  Maybe<capnp::MessageSize> local_f0;
  Maybe<capnp::MessageSize> local_d8;
  Maybe<capnp::MessageSize> local_c0;
  EventLoop loop;
  
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  calleeCallCount = 0;
  callerCallCount = 0;
  kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)&response,&calleeCallCount);
  capnproto_test::capnp::test::TestTailCallee::Client::Client<capnp::_::TestTailCalleeImpl,void>
            (&callee,(Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t> *)&response);
  kj::Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t>::dispose
            ((Own<capnp::_::TestTailCalleeImpl,_std::nullptr_t> *)&response);
  _kjCondition.op.content.ptr = (char *)operator_new(0x28);
  _kjCondition.op.content.ptr[8] = '\0';
  _kjCondition.op.content.ptr[9] = '\0';
  _kjCondition.op.content.ptr[10] = '\0';
  _kjCondition.op.content.ptr[0xb] = '\0';
  _kjCondition.op.content.ptr[0xc] = '\0';
  _kjCondition.op.content.ptr[0xd] = '\0';
  _kjCondition.op.content.ptr[0xe] = '\0';
  _kjCondition.op.content.ptr[0xf] = '\0';
  _kjCondition.op.content.ptr[0x10] = -0x18;
  _kjCondition.op.content.ptr[0x11] = -0x54;
  _kjCondition.op.content.ptr[0x12] = 'e';
  _kjCondition.op.content.ptr[0x13] = '\0';
  _kjCondition.op.content.ptr[0x14] = '\0';
  _kjCondition.op.content.ptr[0x15] = '\0';
  _kjCondition.op.content.ptr[0x16] = '\0';
  _kjCondition.op.content.ptr[0x17] = '\0';
  _kjCondition.op.content.ptr[0x18] = '\0';
  *(undefined ***)_kjCondition.op.content.ptr = &PTR_dispatchCall_0064b280;
  *(int **)(_kjCondition.op.content.ptr + 0x20) = &callerCallCount;
  __n = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl>::instance;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl>::instance;
  _kjCondition._0_8_ =
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl>::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  Capability::Client::makeLocalClient
            ((Client *)&response,(Own<capnp::Capability::Server,_std::nullptr_t> *)&_kjCondition);
  kj::Own<capnp::Capability::Server,_std::nullptr_t>::dispose
            ((Own<capnp::Capability::Server,_std::nullptr_t> *)&_kjCondition);
  response.super_Reader._reader.data = schemas::s_870bf40110ce3035 + 0x48;
  Capability::Client::castAs<capnproto_test::capnp::test::TestTailCaller>
            (&caller,(Client *)&response);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&response);
  kj::Own<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl,_std::nullptr_t> *)
             &request);
  local_c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestTailCaller::Client::fooRequest(&request,&caller,&local_c0);
  *(undefined4 *)request.super_Builder._builder.data = 0x1c8;
  capnproto_test::capnp::test::TestTailCaller::FooParams::Builder::setCallee
            (&request.super_Builder,&callee);
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::send((Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
          *)&promise,(int)&request,__buf,(size_t)__n,in_R8D);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)&_kjCondition,&promise.super_Pipeline);
  local_d8.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)&response,(Client *)&_kjCondition,&local_d8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&dependentCall0,(int)&response,__buf_00,(size_t)__n,in_R8D);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
            ((Own<capnp::RequestHook,_std::nullptr_t> *)&response.super_Reader._reader.nestingLimit)
  ;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition.op);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_> *)
             &response,&promise);
  _kjCondition.right = 0;
  if (0x1f < response.super_Reader._reader.dataSize) {
    _kjCondition.right = *response.super_Reader._reader.data;
  }
  _kjCondition.left = 0x1c8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((_kjCondition.right != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
    dependentCall2.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr._0_4_ = 0;
    dependentCall1.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr._0_4_ = 0x1c8;
    if (0x1f < response.super_Reader._reader.dataSize) {
      dependentCall2.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      .super_PromiseBase.node.ptr._0_4_ = *response.super_Reader._reader.data;
    }
    in_R8D = 0x422c71;
    _kjCondition.result = _kjCondition.right == 0x1c8;
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2f8,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()"
               ,(char (*) [44])"failed: expected (456) == (response.getI())",&_kjCondition,
               (int *)&dependentCall1,(uint *)&dependentCall2);
  }
  __n_00 = (char *)0x0;
  if (0x1f < response.super_Reader._reader.dataSize) {
    __n_00 = (char *)(ulong)*response.super_Reader._reader.data;
  }
  _kjCondition.right = (uint)__n_00;
  _kjCondition.left = 0x1c8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 0x1c8;
  if ((_kjCondition.right != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
    dependentCall2.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr._0_4_ = 0;
    dependentCall1.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
    .super_PromiseBase.node.ptr._0_4_ = 0x1c8;
    if (0x1f < response.super_Reader._reader.dataSize) {
      dependentCall2.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      .super_PromiseBase.node.ptr._0_4_ = *response.super_Reader._reader.data;
    }
    __n_00 = 
    "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()";
    in_R8D = 0x422c71;
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2f9,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()"
               ,(char (*) [44])"failed: expected (456) == (response.getI())",&_kjCondition,
               (int *)&dependentCall1,(uint *)&dependentCall2);
  }
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)&dependentCall2,&promise.super_Pipeline);
  local_f0.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)&_kjCondition,(Client *)&dependentCall2,&local_f0);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&dependentCall1,(int)&_kjCondition,__buf_01,(size_t)__n_00,in_R8D);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
            ((Own<capnp::RequestHook,_std::nullptr_t> *)local_380);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&dependentCall2.super_Pipeline);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Reader::getC
            ((Client *)&_kjCondition_2,&response.super_Reader);
  local_108.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)&_kjCondition,(Client *)&_kjCondition_2,&local_108);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)&dependentCall2,(int)&_kjCondition,__buf_02,(size_t)__n_00,in_R8D);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose
            ((Own<capnp::RequestHook,_std::nullptr_t> *)local_380);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&_kjCondition_2.op);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&_kjCondition,&dependentCall0);
  _kjCondition_2.right = 0;
  if (0x1f < local_388) {
    _kjCondition_2.right = *(uint *)_kjCondition.op.content.size_;
  }
  _kjCondition_2.left = 0;
  _kjCondition_2.result = _kjCondition_2.right == 0;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose
            ((Own<capnp::ResponseHook,_std::nullptr_t> *)(local_380 + 8));
  if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_3ac = 0;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&_kjCondition,&dependentCall0);
    local_340 = 0;
    if (0x1f < local_388) {
      local_340 = *(uint *)_kjCondition.op.content.size_;
    }
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2ff,ERROR,
               "\"failed: expected \" \"(0) == (dependentCall0.wait(waitScope).getN())\", _kjCondition, 0, dependentCall0.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (0) == (dependentCall0.wait(waitScope).getN())",
               &_kjCondition_2,&local_3ac,&local_340);
    kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose
              ((Own<capnp::ResponseHook,_std::nullptr_t> *)(local_380 + 8));
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&_kjCondition,&dependentCall1);
  _kjCondition_2.right = 0;
  if (0x1f < local_388) {
    _kjCondition_2.right = *(uint *)_kjCondition.op.content.size_;
  }
  _kjCondition_2.result = _kjCondition_2.right == 1;
  _kjCondition_2.left = 1;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose
            ((Own<capnp::ResponseHook,_std::nullptr_t> *)(local_380 + 8));
  if ((_kjCondition_2.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_3ac = 1;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&_kjCondition,&dependentCall1);
    local_340 = 0;
    if (0x1f < local_388) {
      local_340 = *(uint *)_kjCondition.op.content.size_;
    }
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x300,ERROR,
               "\"failed: expected \" \"(1) == (dependentCall1.wait(waitScope).getN())\", _kjCondition, 1, dependentCall1.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (1) == (dependentCall1.wait(waitScope).getN())",
               &_kjCondition_2,&local_3ac,&local_340);
    kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose
              ((Own<capnp::ResponseHook,_std::nullptr_t> *)(local_380 + 8));
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&_kjCondition,&dependentCall2);
  _kjCondition_2.right = 0;
  if (0x1f < local_388) {
    _kjCondition_2.right = *(uint *)_kjCondition.op.content.size_;
  }
  _kjCondition_2.result = _kjCondition_2.right == 2;
  _kjCondition_2.left = 2;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose
            ((Own<capnp::ResponseHook,_std::nullptr_t> *)(local_380 + 8));
  if (kj::_::Debug::minSeverity < 3 && _kjCondition_2.result == false) {
    local_3ac = 2;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&_kjCondition,&dependentCall2);
    local_340 = 0;
    if (0x1f < local_388) {
      local_340 = *(uint *)_kjCondition.op.content.size_;
    }
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x301,ERROR,
               "\"failed: expected \" \"(2) == (dependentCall2.wait(waitScope).getN())\", _kjCondition, 2, dependentCall2.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (2) == (dependentCall2.wait(waitScope).getN())",
               &_kjCondition_2,&local_3ac,&local_340);
    kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose
              ((Own<capnp::ResponseHook,_std::nullptr_t> *)(local_380 + 8));
  }
  _kjCondition.left = 1;
  _kjCondition.op.content.ptr = (char *)&calleeCallCount;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3d166;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (kj::_::Debug::minSeverity < 3 && calleeCallCount != 1) {
    _kjCondition_2.left = 1;
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x303,ERROR,
               "\"failed: expected \" \"(1) == (calleeCallCount)\", _kjCondition, 1, calleeCallCount"
               ,(char (*) [42])"failed: expected (1) == (calleeCallCount)",
               (DebugComparison<int,_int_&> *)&_kjCondition,&_kjCondition_2.left,
               (int *)_kjCondition.op.content.ptr);
  }
  _kjCondition.left = 1;
  _kjCondition.op.content.ptr = (char *)&callerCallCount;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3d166;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((callerCallCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 1;
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x304,ERROR,
               "\"failed: expected \" \"(1) == (callerCallCount)\", _kjCondition, 1, callerCallCount"
               ,(char (*) [42])"failed: expected (1) == (callerCallCount)",
               (DebugComparison<int,_int_&> *)&_kjCondition,&_kjCondition_2.left,
               (int *)_kjCondition.op.content.ptr);
  }
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&dependentCall2);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&dependentCall1);
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&response.hook);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            (&dependentCall0);
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult>::~RemotePromise(&promise);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&request.hook);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&caller.field_0x8);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&callee.field_0x8);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, DynamicServerTailCall) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int calleeCallCount = 0;
  int callerCallCount = 0;

  test::TestTailCallee::Client callee(kj::heap<TestTailCalleeImpl>(calleeCallCount));
  test::TestTailCaller::Client caller =
      DynamicCapability::Client(kj::heap<TestTailCallerDynamicImpl>(callerCallCount))
          .castAs<test::TestTailCaller>();

  auto request = caller.fooRequest();
  request.setI(456);
  request.setCallee(callee);

  auto promise = request.send();

  auto dependentCall0 = promise.getC().getCallSequenceRequest().send();

  auto response = promise.wait(waitScope);
  EXPECT_EQ(456, response.getI());
  EXPECT_EQ(456, response.getI());

  auto dependentCall1 = promise.getC().getCallSequenceRequest().send();

  auto dependentCall2 = response.getC().getCallSequenceRequest().send();

  EXPECT_EQ(0, dependentCall0.wait(waitScope).getN());
  EXPECT_EQ(1, dependentCall1.wait(waitScope).getN());
  EXPECT_EQ(2, dependentCall2.wait(waitScope).getN());

  EXPECT_EQ(1, calleeCallCount);
  EXPECT_EQ(1, callerCallCount);
}